

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bork.cpp
# Opt level: O1

void from_file(string *filename)

{
  undefined1 auVar1 [16];
  string buf;
  context c;
  ifstream f;
  string local_2b0;
  undefined1 *local_290 [2];
  undefined1 local_280 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_270;
  long local_238 [4];
  int aiStack_218 [122];
  
  std::ifstream::ifstream(local_238,(string *)filename,_S_in);
  local_2b0._M_string_length = 0;
  local_2b0.field_2._M_local_buf[0] = '\0';
  local_270._M_buckets = &local_270._M_single_bucket;
  local_270._M_bucket_count = 1;
  local_270._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_270._M_element_count = 0;
  local_270._M_rehash_policy._M_max_load_factor = 1.0;
  local_270._M_rehash_policy._M_next_resize = 0;
  local_270._M_single_bucket = (__node_base_ptr)0x0;
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  stdlib::init_stdlib((unordered_map *)&local_270);
  if (*(int *)((long)aiStack_218 + *(long *)(local_238[0] + -0x18)) == 0) {
    do {
      read_exp((ifstream *)local_238,&local_2b0);
      local_290[0] = local_280;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_290,local_2b0._M_dataplus._M_p,
                 local_2b0._M_dataplus._M_p + local_2b0._M_string_length);
      auVar1 = parser::parse((string *)local_290);
      eval::eval(auVar1._0_8_,(thing *)&local_270,auVar1._8_8_);
      if (local_290[0] != local_280) {
        operator_delete(local_290[0]);
      }
      local_2b0._M_string_length = 0;
      *local_2b0._M_dataplus._M_p = '\0';
    } while (*(int *)((long)aiStack_218 + *(long *)(local_238[0] + -0x18)) == 0);
  }
  std::ifstream::close();
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_eval::value_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_270);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p);
  }
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

void from_file(const std::string &filename) {

  std::ifstream f(filename);
  std::string buf;

  context c;
  stdlib::init_stdlib(c);

  while (f.good()) {

    read_exp(f, buf);
    eval::eval(parser::parse(buf), c);
    buf.clear();

  }

  f.close();

}